

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# table.cpp
# Opt level: O0

void __thiscall Table_MultipleKeys_Test::~Table_MultipleKeys_Test(Table_MultipleKeys_Test *this)

{
  Table_MultipleKeys_Test *this_local;
  
  ~Table_MultipleKeys_Test(this);
  operator_delete(this);
  return;
}

Assistant:

TEST(Table, MultipleKeys) {
    std::istringstream input("[table.123.\"table\\ntable\"]");
    events_aggregator_t handler;

    loltoml::parse(input, handler);

    std::vector<sax_event_t> expected_events = {
        {sax_event_t::start_document},
        {sax_event_t::table, {"table", "123", "table\ntable"}},
        {sax_event_t::finish_document}
    };

    EXPECT_EQ(expected_events, handler.events);
}